

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::SingularFieldHelper<15>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  FieldMetadata *md_local;
  void *field_local;
  
  WriteTagTo<google::protobuf::io::CodedOutputStream>(md->tag,output);
  SerializeTo<15,google::protobuf::io::CodedOutputStream>(field,output);
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeTo<type>(field, output);
  }